

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect(Curl_cfilter *cf,Curl_easy *data)

{
  CURLcode CVar1;
  _Bool local_1;
  
  CVar1 = ossl_connect_common(cf,data,false,&local_1);
  return CVar1;
}

Assistant:

static CURLcode ossl_connect(struct Curl_cfilter *cf,
                             struct Curl_easy *data)
{
  CURLcode result;
  bool done = FALSE;

  result = ossl_connect_common(cf, data, FALSE, &done);
  if(result)
    return result;

  DEBUGASSERT(done);

  return CURLE_OK;
}